

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robotKuka.cpp
# Opt level: O1

void __thiscall RobotKuka::RobotKuka(RobotKuka *this,float CYCLE_TIME)

{
  (this->move_queue).c.super__Deque_base<Pose,_std::allocator<Pose>_>._M_impl.super__Deque_impl_data
  ._M_finish._M_last = (_Elt_pointer)0x0;
  (this->move_queue).c.super__Deque_base<Pose,_std::allocator<Pose>_>._M_impl.super__Deque_impl_data
  ._M_finish._M_node = (_Map_pointer)0x0;
  (this->move_queue).c.super__Deque_base<Pose,_std::allocator<Pose>_>._M_impl.super__Deque_impl_data
  ._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->move_queue).c.super__Deque_base<Pose,_std::allocator<Pose>_>._M_impl.super__Deque_impl_data
  ._M_finish._M_first = (_Elt_pointer)0x0;
  (this->move_queue).c.super__Deque_base<Pose,_std::allocator<Pose>_>._M_impl.super__Deque_impl_data
  ._M_start._M_last = (_Elt_pointer)0x0;
  (this->move_queue).c.super__Deque_base<Pose,_std::allocator<Pose>_>._M_impl.super__Deque_impl_data
  ._M_start._M_node = (_Map_pointer)0x0;
  (this->move_queue).c.super__Deque_base<Pose,_std::allocator<Pose>_>._M_impl.super__Deque_impl_data
  ._M_start._M_cur = (_Elt_pointer)0x0;
  (this->move_queue).c.super__Deque_base<Pose,_std::allocator<Pose>_>._M_impl.super__Deque_impl_data
  ._M_start._M_first = (_Elt_pointer)0x0;
  (this->move_queue).c.super__Deque_base<Pose,_std::allocator<Pose>_>._M_impl.super__Deque_impl_data
  ._M_map = (_Map_pointer)0x0;
  (this->move_queue).c.super__Deque_base<Pose,_std::allocator<Pose>_>._M_impl.super__Deque_impl_data
  ._M_map_size = 0;
  std::_Deque_base<Pose,_std::allocator<Pose>_>::_M_initialize_map
            ((_Deque_base<Pose,_std::allocator<Pose>_> *)&this->move_queue,0);
  Pose::Pose(&this->security_limit_speed,100.0,100.0,100.0,60.0,60.0,60.0);
  this->CYCLE_TIME = CYCLE_TIME;
  return;
}

Assistant:

RobotKuka::RobotKuka(float CYCLE_TIME)
{
	this->CYCLE_TIME = CYCLE_TIME;
}